

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeTypeUrlOrFullTypeName
          (ParserImpl *this,string *name)

{
  bool bVar1;
  undefined1 local_c0 [8];
  string part;
  string local_98;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string connector;
  string *name_local;
  ParserImpl *this_local;
  
  connector.field_2._8_8_ = name;
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    do {
      std::__cxx11::string::string(local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,".",&local_61);
      bVar1 = TryConsume(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      if (bVar1) {
        std::__cxx11::string::operator=(local_40,".");
LAB_004b8335:
        std::__cxx11::string::string((string *)local_c0);
        bVar1 = ConsumeIdentifier(this,(string *)local_c0);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)connector.field_2._8_8_,local_40);
          std::__cxx11::string::operator+=((string *)connector.field_2._8_8_,(string *)local_c0);
        }
        else {
          this_local._7_1_ = 0;
        }
        part.field_2._9_3_ = 0;
        part.field_2._M_local_buf[8] = !bVar1;
        std::__cxx11::string::~string((string *)local_c0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"/",(allocator<char> *)(part.field_2._M_local_buf + 0xf));
        bVar1 = TryConsume(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)(part.field_2._M_local_buf + 0xf));
        if (bVar1) {
          std::__cxx11::string::operator=(local_40,"/");
          goto LAB_004b8335;
        }
        part.field_2._8_4_ = 3;
      }
      std::__cxx11::string::~string(local_40);
    } while (part.field_2._8_4_ == 0);
    if (part.field_2._8_4_ != 1) {
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeTypeUrlOrFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (true) {
      std::string connector;
      if (TryConsume(".")) {
        connector = ".";
      } else if (TryConsume("/")) {
        connector = "/";
      } else {
        break;
      }
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += connector;
      *name += part;
    }
    return true;
  }